

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result wabt::interp::Match(GlobalType *expected,GlobalType *actual,string *out_msg)

{
  _Alloc_hider _Var1;
  string local_80;
  string local_60;
  string local_40;
  
  if (actual->mut == expected->mut) {
    local_80._M_dataplus._M_p = *(pointer *)&(expected->super_ExternType).field_0xc;
    if (*(pointer *)&(actual->super_ExternType).field_0xc == local_80._M_dataplus._M_p) {
      return (Result)Ok;
    }
    Type::GetName_abi_cxx11_(&local_40,(Type *)&local_80);
    _Var1._M_p = local_40._M_dataplus._M_p;
    local_80._M_dataplus._M_p = *(pointer *)&(actual->super_ExternType).field_0xc;
    Type::GetName_abi_cxx11_(&local_60,(Type *)&local_80);
    StringPrintf_abi_cxx11_
              (&local_80,"type mismatch in imported global, expected %s but got %s.",_Var1._M_p,
               local_60._M_dataplus._M_p);
    std::__cxx11::string::operator=((string *)out_msg,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_80.field_2._M_allocated_capacity = local_40.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return (Result)Error;
    }
  }
  else {
    StringPrintf_abi_cxx11_
              (&local_80,"mutability mismatch in imported global, expected %s but got %s.",
               GetName::kNames[(int)actual->mut],GetName::kNames[(int)expected->mut]);
    std::__cxx11::string::operator=((string *)out_msg,(string *)&local_80);
    local_40._M_dataplus._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return (Result)Error;
    }
  }
  operator_delete(local_40._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  return (Result)Error;
}

Assistant:

Result Match(const GlobalType& expected,
             const GlobalType& actual,
             std::string* out_msg) {
  if (actual.mut != expected.mut) {
    *out_msg = StringPrintf(
        "mutability mismatch in imported global, expected %s but got %s.",
        GetName(actual.mut), GetName(expected.mut));
    return Result::Error;
  }

  if (actual.type != expected.type &&
      (expected.mut == Mutability::Var ||
       !TypesMatch(expected.type, actual.type))) {
    *out_msg = StringPrintf(
        "type mismatch in imported global, expected %s but got %s.",
        GetName(expected.type).c_str(), GetName(actual.type).c_str());
    return Result::Error;
  }

  return Result::Ok;
}